

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QColorListModel.cpp
# Opt level: O3

void __thiscall QColorListModel::setNameFormat(QColorListModel *this,NameFormat nameFormat)

{
  int iVar1;
  int local_ac;
  QArrayDataPointer<int> local_a8;
  QModelIndex local_88;
  undefined1 local_70 [24];
  undefined8 local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 uStack_18;
  
  this->d->nameFormat = nameFormat;
  local_88.r = -1;
  local_88.c = -1;
  local_88.i = 0;
  local_88.m = (QAbstractItemModel *)0x0;
  iVar1 = (**(code **)(*(long *)this + 0x78))();
  if (0 < iVar1) {
    local_28 = 0xffffffffffffffff;
    local_20 = 0;
    uStack_18 = 0;
    (**(code **)(*(long *)this + 0x60))(&local_88,this,0,0);
    local_40 = 0xffffffffffffffff;
    local_38 = 0;
    uStack_30 = 0;
    iVar1 = (**(code **)(*(long *)this + 0x78))(this);
    local_58 = 0xffffffffffffffff;
    local_50 = 0;
    uStack_48 = 0;
    (**(code **)(*(long *)this + 0x60))(local_70,this,iVar1 + -1,0);
    local_a8.d = (Data *)0x0;
    local_a8.ptr = (int *)0x0;
    local_a8.size = 0;
    local_ac = 0;
    QtPrivate::QPodArrayOps<int>::emplace<int&>((QPodArrayOps<int> *)&local_a8,0,&local_ac);
    QAbstractItemModel::dataChanged((QModelIndex *)this,&local_88,(QList *)local_70);
    QArrayDataPointer<int>::~QArrayDataPointer(&local_a8);
  }
  return;
}

Assistant:

void QColorListModel::setNameFormat(QColorListModel::NameFormat nameFormat) {
    d->nameFormat = nameFormat;

    if (rowCount() > 0) {
        Q_EMIT dataChanged(index(0, 0), index(rowCount() - 1, 0), QVector<int>() << Qt::DisplayRole);
    }
}